

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O3

void Lpk_TryDec(word *pTruth,int nVars)

{
  word wVar1;
  
  if (nVars == 8) {
    wVar1 = If_Dec6Perform(*pTruth,1);
    printf("%d",(ulong)(wVar1 != 0));
    wVar1 = If_Dec6Perform(pTruth[1],1);
    printf("%d",(ulong)(wVar1 != 0));
    wVar1 = If_Dec6Perform(pTruth[2],1);
    printf("%d",(ulong)(wVar1 != 0));
    wVar1 = If_Dec6Perform(pTruth[3],1);
    printf("%d",(ulong)(wVar1 != 0));
    putchar(10);
    return;
  }
  __assert_fail("nVars == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                ,0x106,"void Lpk_TryDec(word *, int)");
}

Assistant:

void Lpk_TryDec( word * pTruth, int nVars )
{
    extern word If_Dec6Perform( word t, int fDerive );
    extern void If_Dec6Verify( word t, word z );
    //int nWords = Abc_Truth6WordNum( nVars );
    assert( nVars == 8 );
    printf( "%d", If_Dec6Perform(pTruth[0], 1) > 0 );
    printf( "%d", If_Dec6Perform(pTruth[1], 1) > 0 );
    printf( "%d", If_Dec6Perform(pTruth[2], 1) > 0 );
    printf( "%d", If_Dec6Perform(pTruth[3], 1) > 0 );
    printf( "\n" );
}